

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_bufferMode_e ZVar1;
  ZSTD_cStreamStage ZVar2;
  void *pvVar3;
  void *pvVar4;
  size_t err_code;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  bool bVar8;
  void *pvVar9;
  char *dst;
  char *dst_00;
  ulong uVar10;
  void *pvVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  size_t sStack_90;
  void *local_78;
  char *local_60;
  
  if (output->size < output->pos) {
    sStack_90 = 0xffffffffffffffba;
  }
  else {
    uVar7 = input->size;
    uVar10 = input->pos;
    if (uVar7 < uVar10) {
      sStack_90 = 0xffffffffffffffb8;
    }
    else if (endOp < (ZSTD_e_end|ZSTD_e_flush)) {
      if (cctx == (ZSTD_CCtx *)0x0) {
        __assert_fail("cctx != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x1843,
                      "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
      sStack_90 = 0xffffffffffffffce;
      if (cctx->streamStage == zcss_init) {
        sVar5 = (uVar7 - uVar10) + cctx->stableIn_notConsumed;
        if (((endOp == ZSTD_e_continue) && ((cctx->requestedParams).inBufferMode == ZSTD_bm_stable))
           && (sVar5 < 0x20000)) {
          if (cctx->stableIn_notConsumed != 0) {
            if (input->src != (cctx->expectedInBuffer).src) {
              return 0xffffffffffffffce;
            }
            if (uVar10 != (cctx->expectedInBuffer).size) {
              return 0xffffffffffffffce;
            }
          }
          input->pos = uVar7;
          (cctx->expectedInBuffer).pos = uVar7;
          sVar6 = input->size;
          (cctx->expectedInBuffer).src = input->src;
          (cctx->expectedInBuffer).size = sVar6;
          cctx->stableIn_notConsumed = sVar5;
          return (ulong)((cctx->requestedParams).format == ZSTD_f_zstd1) * 4 + 2;
        }
        sVar5 = ZSTD_CCtx_init_compressStream2(cctx,endOp,sVar5);
        if (0xffffffffffffff88 < sVar5) {
          return sVar5;
        }
        ZSTD_setBufferExpectations(cctx,output,input);
      }
      ZVar1 = (cctx->appliedParams).inBufferMode;
      if (((ZVar1 != ZSTD_bm_stable) ||
          (((cctx->expectedInBuffer).src == input->src &&
           ((cctx->expectedInBuffer).pos == input->pos)))) &&
         (((cctx->appliedParams).outBufferMode != ZSTD_bm_stable ||
          (cctx->expectedOutBufferSize == output->size - output->pos)))) {
        pvVar3 = input->src;
        if (pvVar3 == (void *)0x0) {
          local_78 = (void *)0x0;
          pvVar9 = (void *)0x0;
        }
        else {
          local_78 = (void *)(input->size + (long)pvVar3);
          pvVar9 = (void *)(input->pos + (long)pvVar3);
        }
        pvVar4 = output->dst;
        if (pvVar4 == (void *)0x0) {
          local_60 = (char *)0x0;
          dst_00 = (char *)0x0;
        }
        else {
          local_60 = (char *)(output->size + (long)pvVar4);
          dst_00 = (char *)(output->pos + (long)pvVar4);
        }
        if (ZVar1 == ZSTD_bm_buffered) {
          if (cctx->inBuff == (char *)0x0) {
            __assert_fail("zcs->inBuff != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x16fe,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          if (cctx->inBuffSize == 0) {
            __assert_fail("zcs->inBuffSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x16ff,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
        }
        else if (ZVar1 == ZSTD_bm_stable) {
          uVar7 = cctx->stableIn_notConsumed;
          if (input->pos < uVar7) {
            __assert_fail("input->pos >= zcs->stableIn_notConsumed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x16f8,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          input->pos = input->pos - uVar7;
          pvVar9 = (void *)((long)pvVar9 - uVar7);
          cctx->stableIn_notConsumed = 0;
        }
        if ((cctx->appliedParams).outBufferMode == ZSTD_bm_buffered) {
          if (cctx->outBuff == (char *)0x0) {
            __assert_fail("zcs->outBuff != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x1702,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          if (cctx->outBuffSize == 0) {
            __assert_fail("zcs->outBuffSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x1703,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
        }
        uVar7 = input->size;
        if (pvVar3 == (void *)0x0) {
          if (uVar7 != 0) {
            __assert_fail("input->size == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x1705,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          uVar7 = 0;
        }
        if (uVar7 < input->pos) {
          __assert_fail("input->pos <= input->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x1706,
                        "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                       );
        }
        uVar7 = output->size;
        if (pvVar4 == (void *)0x0) {
          if (uVar7 != 0) {
            __assert_fail("output->size == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x1707,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          uVar7 = 0;
        }
        if (uVar7 < output->pos) {
          __assert_fail("output->pos <= output->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x1708,
                        "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                       );
        }
        bVar13 = false;
LAB_006289f6:
        while( true ) {
          if (bVar13) {
            input->pos = (long)pvVar9 - (long)pvVar3;
            output->pos = (long)dst_00 - (long)pvVar4;
            if ((cctx->frameEnded == 0) &&
               (sVar5 = ZSTD_nextInputSizeHint(cctx), 0xffffffffffffff88 < sVar5)) {
              return sVar5;
            }
            ZSTD_setBufferExpectations(cctx,output,input);
            return cctx->outBuffContentSize - cctx->outBuffFlushedSize;
          }
          ZVar2 = cctx->streamStage;
          if (ZVar2 == zcss_load) break;
          if (ZVar2 != zcss_flush) {
            if (ZVar2 == zcss_init) {
              return 0xffffffffffffffc2;
            }
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x1796,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
LAB_00628d67:
          if ((cctx->appliedParams).outBufferMode != ZSTD_bm_buffered) {
            __assert_fail("zcs->appliedParams.outBufferMode == ZSTD_bm_buffered",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x177b,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          sVar5 = cctx->outBuffFlushedSize;
          uVar12 = cctx->outBuffContentSize - sVar5;
          uVar10 = (long)local_60 - (long)dst_00;
          uVar7 = uVar12;
          if (uVar10 < uVar12) {
            uVar7 = uVar10;
          }
          if (uVar7 != 0) {
            memcpy(dst_00,cctx->outBuff + sVar5,uVar7);
            sVar5 = cctx->outBuffFlushedSize;
          }
          dst_00 = dst_00 + uVar7;
          cctx->outBuffFlushedSize = sVar5 + uVar7;
          if (uVar10 < uVar12) {
            bVar13 = true;
            if (dst_00 != local_60) {
              __assert_fail("op==oend",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                            ,0x1786,
                            "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                           );
            }
          }
          else {
            cctx->outBuffContentSize = 0;
            cctx->outBuffFlushedSize = 0;
            if (cctx->frameEnded != 0) goto LAB_00628e1f;
            cctx->streamStage = zcss_load;
            bVar13 = false;
          }
        }
        if (endOp == ZSTD_e_end) {
          sVar5 = ZSTD_compressBound((long)local_78 - (long)pvVar9);
          if (((sVar5 <= (ulong)((long)local_60 - (long)dst_00)) ||
              ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable)) && (cctx->inBuffPos == 0)) {
            sVar5 = ZSTD_compressEnd_public
                              (cctx,dst_00,(long)local_60 - (long)dst_00,pvVar9,
                               (long)local_78 - (long)pvVar9);
            if (0xffffffffffffff88 < sVar5) {
              return sVar5;
            }
            cctx->streamStage = zcss_init;
            cctx->frameEnded = 1;
            cctx->pledgedSrcSizePlusOne = 0;
            dst_00 = dst_00 + sVar5;
            bVar13 = true;
            pvVar9 = local_78;
            goto LAB_006289f6;
          }
        }
        ZVar1 = (cctx->appliedParams).inBufferMode;
        pvVar11 = pvVar9;
        if (ZVar1 == ZSTD_bm_stable) {
          if (endOp == ZSTD_e_flush) {
            bVar13 = true;
            if (pvVar9 == local_78) goto LAB_006289f6;
          }
          else if (endOp == ZSTD_e_continue) {
            if (cctx->blockSize <= (ulong)((long)local_78 - (long)pvVar9)) goto LAB_00628b50;
            cctx->stableIn_notConsumed = (long)local_78 - (long)pvVar9;
            bVar13 = true;
            pvVar9 = local_78;
            goto LAB_006289f6;
          }
          sVar5 = (long)local_60 - (long)dst_00;
LAB_00628b64:
          uVar7 = (long)local_78 - (long)pvVar11;
          if (cctx->blockSize <= (ulong)((long)local_78 - (long)pvVar11)) {
            uVar7 = cctx->blockSize;
          }
          bVar13 = false;
          pvVar9 = pvVar11;
        }
        else {
          if (ZVar1 != ZSTD_bm_buffered) {
            __assert_fail("zcs->appliedParams.inBufferMode == ZSTD_bm_stable",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x1734,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          sVar5 = cctx->inBuffPos;
          uVar10 = cctx->inBuffTarget - sVar5;
          uVar7 = (long)local_78 - (long)pvVar9;
          if (uVar10 < (ulong)((long)local_78 - (long)pvVar9)) {
            uVar7 = uVar10;
          }
          if (uVar7 != 0) {
            memcpy(cctx->inBuff + sVar5,pvVar9,uVar7);
            sVar5 = cctx->inBuffPos;
          }
          uVar10 = sVar5 + uVar7;
          cctx->inBuffPos = uVar10;
          pvVar11 = (void *)(uVar7 + (long)pvVar9);
          if (pvVar9 == (void *)0x0) {
            pvVar11 = pvVar9;
          }
          pvVar9 = pvVar11;
          if (endOp == ZSTD_e_flush) {
            bVar13 = true;
            if (uVar10 == cctx->inToCompress) goto LAB_006289f6;
          }
          else if ((endOp == ZSTD_e_continue) && (bVar13 = true, uVar10 < cctx->inBuffTarget))
          goto LAB_006289f6;
LAB_00628b50:
          sVar5 = (long)local_60 - (long)dst_00;
          if ((cctx->appliedParams).inBufferMode != ZSTD_bm_buffered) goto LAB_00628b64;
          uVar7 = cctx->inBuffPos - cctx->inToCompress;
          bVar13 = true;
          pvVar9 = pvVar11;
        }
        sVar6 = ZSTD_compressBound(uVar7);
        dst = dst_00;
        if ((sVar5 < sVar6) && ((cctx->appliedParams).outBufferMode != ZSTD_bm_stable)) {
          sVar5 = cctx->outBuffSize;
          dst = cctx->outBuff;
        }
        if (bVar13) {
          bVar13 = endOp == ZSTD_e_end;
          bVar14 = pvVar9 == local_78;
          bVar8 = bVar14 && bVar13;
          if (bVar14 && bVar13) {
            uVar7 = ZSTD_compressEnd_public(cctx,dst,sVar5,cctx->inBuff + cctx->inToCompress,uVar7);
          }
          else {
            uVar7 = ZSTD_compressContinue_public
                              (cctx,dst,sVar5,cctx->inBuff + cctx->inToCompress,uVar7);
          }
          if (0xffffffffffffff88 < uVar7) {
            return uVar7;
          }
          cctx->frameEnded = (uint)bVar8;
          sVar5 = cctx->inBuffPos;
          sVar6 = cctx->blockSize;
          uVar10 = sVar6 + sVar5;
          cctx->inBuffTarget = uVar10;
          if (cctx->inBuffSize < uVar10) {
            cctx->inBuffPos = 0;
            cctx->inBuffTarget = sVar6;
            sVar5 = 0;
            uVar10 = sVar6;
          }
          if ((!bVar14 || !bVar13) && cctx->inBuffSize < uVar10) {
            __assert_fail("zcs->inBuffTarget <= zcs->inBuffSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x175e,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
          cctx->inToCompress = sVar5;
        }
        else {
          pvVar11 = (void *)((long)pvVar9 + uVar7);
          bVar8 = pvVar11 == local_78 && endOp == ZSTD_e_end;
          if (pvVar11 == local_78 && endOp == ZSTD_e_end) {
            uVar7 = ZSTD_compressEnd_public(cctx,dst,sVar5,pvVar9,uVar7);
          }
          else {
            uVar7 = ZSTD_compressContinue_public(cctx,dst,sVar5,pvVar9,uVar7);
          }
          if (0xffffffffffffff88 < uVar7) {
            return uVar7;
          }
          if (pvVar9 == (void *)0x0) {
            pvVar11 = pvVar9;
          }
          pvVar9 = pvVar11;
          cctx->frameEnded = (uint)bVar8;
          if (pvVar9 != local_78 && bVar8) {
            __assert_fail("ip == iend",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x1769,
                          "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                         );
          }
        }
        if (dst != dst_00) {
          cctx->outBuffContentSize = uVar7;
          cctx->outBuffFlushedSize = 0;
          cctx->streamStage = zcss_flush;
          goto LAB_00628d67;
        }
        dst_00 = dst_00 + uVar7;
        bVar13 = false;
        if (bVar8) {
LAB_00628e1f:
          cctx->streamStage = zcss_init;
          cctx->pledgedSrcSizePlusOne = 0;
          bVar13 = true;
        }
        goto LAB_006289f6;
      }
    }
    else {
      sStack_90 = 0xffffffffffffffd6;
    }
  }
  return sStack_90;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, dstSize_tooSmall, "invalid output buffer");
    RETURN_ERROR_IF(input->pos  > input->size, srcSize_wrong, "invalid input buffer");
    RETURN_ERROR_IF((U32)endOp > (U32)ZSTD_e_end, parameter_outOfBound, "invalid endDirective");
    assert(cctx != NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        size_t const inputSize = input->size - input->pos;  /* no obligation to start from pos==0 */
        size_t const totalInputSize = inputSize + cctx->stableIn_notConsumed;
        if ( (cctx->requestedParams.inBufferMode == ZSTD_bm_stable) /* input is presumed stable, across invocations */
          && (endOp == ZSTD_e_continue)                             /* no flush requested, more input to come */
          && (totalInputSize < ZSTD_BLOCKSIZE_MAX) ) {              /* not even reached one block yet */
            if (cctx->stableIn_notConsumed) {  /* not the first time */
                /* check stable source guarantees */
                RETURN_ERROR_IF(input->src != cctx->expectedInBuffer.src, stabilityCondition_notRespected, "stableInBuffer condition not respected: wrong src pointer");
                RETURN_ERROR_IF(input->pos != cctx->expectedInBuffer.size, stabilityCondition_notRespected, "stableInBuffer condition not respected: externally modified pos");
            }
            /* pretend input was consumed, to give a sense forward progress */
            input->pos = input->size;
            /* save stable inBuffer, for later control, and flush/end */
            cctx->expectedInBuffer = *input;
            /* but actually input wasn't consumed, so keep track of position from where compression shall resume */
            cctx->stableIn_notConsumed += inputSize;
            /* don't initialize yet, wait for the first block of flush() order, for better parameters adaptation */
            return ZSTD_FRAMEHEADERSIZE_MIN(cctx->requestedParams.format);  /* at least some header to produce */
        }
        FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, endOp, totalInputSize), "compressStream2 initialization failed");
        ZSTD_setBufferExpectations(cctx, output, input);   /* Set initial buffer expectations now that we've initialized */
    }
    /* end of transparent initialization stage */

    FORWARD_IF_ERROR(ZSTD_checkBufferStability(cctx, output, input, endOp), "invalid buffers");
    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        size_t flushMin;
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        if (cctx->stableIn_notConsumed) {
            assert(cctx->appliedParams.inBufferMode == ZSTD_bm_stable);
            /* some early data was skipped - make it available for consumption */
            assert(input->pos >= cctx->stableIn_notConsumed);
            input->pos -= cctx->stableIn_notConsumed;
            cctx->stableIn_notConsumed = 0;
        }
        for (;;) {
            size_t const ipos = input->pos;
            size_t const opos = output->pos;
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            cctx->consumedSrcSize += (U64)(input->pos - ipos);
            cctx->producedCSize += (U64)(output->pos - opos);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                if (flushMin == 0)
                    ZSTD_CCtx_trace(cctx, 0);
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin, "ZSTDMT_compressStream_generic failed");

            if (endOp == ZSTD_e_continue) {
                /* We only require some progress with ZSTD_e_continue, not maximal progress.
                 * We're done if we've consumed or produced any bytes, or either buffer is
                 * full.
                 */
                if (input->pos != ipos || output->pos != opos || input->pos == input->size || output->pos == output->size)
                    break;
            } else {
                assert(endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
                /* We require maximal progress. We're done when the flush is complete or the
                 * output buffer is full.
                 */
                if (flushMin == 0 || output->pos == output->size)
                    break;
            }
        }
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size);
        ZSTD_setBufferExpectations(cctx, output, input);
        return flushMin;
    }
#endif /* ZSTD_MULTITHREAD */
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) , "");
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    ZSTD_setBufferExpectations(cctx, output, input);
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}